

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O2

void google::protobuf::compiler::java::anon_unknown_2::SetPrimitiveVariables
               (FieldDescriptor *descriptor,int messageBitIndex,int builderBitIndex,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  int field_number;
  java *this;
  uint32 uVar1;
  FieldType type;
  uint uVar2;
  mapped_type *pmVar3;
  int i;
  uint i_00;
  int i_01;
  int bitIndex;
  int bitIndex_00;
  int bitIndex_01;
  int bitIndex_02;
  int bitIndex_03;
  int bitIndex_04;
  int bitIndex_05;
  int bitIndex_06;
  int bitIndex_07;
  int bitIndex_08;
  int bitIndex_09;
  int bitIndex_10;
  undefined4 in_register_00000014;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  key_type kStack_98;
  string local_78;
  allocator<char> local_51;
  key_type local_50;
  
  this = (java *)(ulong)(uint)messageBitIndex;
  UnderscoresToCamelCase_abi_cxx11_
            (&local_78,(java *)descriptor,
             (FieldDescriptor *)CONCAT44(in_register_00000014,builderBitIndex));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_98,"name",(allocator<char> *)&local_50);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_98);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_78);
  std::__cxx11::string::~string((string *)&kStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_78,(java *)descriptor,field);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_98,"capitalized_name",(allocator<char> *)&local_50);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_98);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_78);
  std::__cxx11::string::~string((string *)&kStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  FieldConstantName_abi_cxx11_(&local_78,(java *)descriptor,field_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_98,"constant_name",(allocator<char> *)&local_50);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_98);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_78);
  std::__cxx11::string::~string((string *)&kStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  SimpleItoa_abi_cxx11_(&local_78,(protobuf *)(ulong)*(uint *)(descriptor + 0x28),i);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_98,"number",(allocator<char> *)&local_50);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_98);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_78);
  std::__cxx11::string::~string((string *)&kStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"empty_list",(allocator<char> *)&kStack_98);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_78);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&local_78);
  DefaultValue_abi_cxx11_(&local_78,(java *)descriptor,field_01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_98,"default",(allocator<char> *)&local_50);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_98);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_78);
  std::__cxx11::string::~string((string *)&kStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  DefaultValue_abi_cxx11_(&kStack_98,(java *)descriptor,field_02);
  std::operator+(&local_78,"= ",&kStack_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"default_init",&local_51);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_50);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&kStack_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"capitalized_type",(allocator<char> *)&kStack_98);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_78);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&local_78);
  uVar1 = internal::WireFormat::MakeTag(descriptor);
  SimpleItoa_abi_cxx11_(&local_78,(protobuf *)(ulong)uVar1,i_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_98,"tag",(allocator<char> *)&local_50);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_98);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_78);
  std::__cxx11::string::~string((string *)&kStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  field_number = *(int *)(descriptor + 0x28);
  type = GetType(descriptor);
  uVar2 = internal::WireFormatLite::TagSize(field_number,type);
  SimpleItoa_abi_cxx11_(&local_78,(protobuf *)(ulong)uVar2,i_01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_98,"tag_size",(allocator<char> *)&local_50);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_98);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_78);
  std::__cxx11::string::~string((string *)&kStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"null_check",(allocator<char> *)&kStack_98);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_78);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"deprecation",(allocator<char> *)&kStack_98);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_78);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"on_changed",(allocator<char> *)&kStack_98);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_78);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&local_78);
  GenerateGetBit_abi_cxx11_(&local_78,this,bitIndex);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_98,"get_has_field_bit_message",(allocator<char> *)&local_50);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_98);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_78);
  std::__cxx11::string::~string((string *)&kStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  GenerateSetBit_abi_cxx11_(&local_78,this,bitIndex_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_98,"set_has_field_bit_message",(allocator<char> *)&local_50);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_98);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_78);
  std::__cxx11::string::~string((string *)&kStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  GenerateGetBit_abi_cxx11_(&local_78,(java *)(ulong)(uint)builderBitIndex,bitIndex_01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_98,"get_has_field_bit_builder",(allocator<char> *)&local_50);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_98);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_78);
  std::__cxx11::string::~string((string *)&kStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  GenerateSetBit_abi_cxx11_(&local_78,(java *)(ulong)(uint)builderBitIndex,bitIndex_02);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_98,"set_has_field_bit_builder",(allocator<char> *)&local_50);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_98);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_78);
  std::__cxx11::string::~string((string *)&kStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  GenerateClearBit_abi_cxx11_(&local_78,(java *)(ulong)(uint)builderBitIndex,bitIndex_03);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_98,"clear_has_field_bit_builder",(allocator<char> *)&local_50);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_98);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_78);
  std::__cxx11::string::~string((string *)&kStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  GenerateGetBit_abi_cxx11_(&local_78,(java *)(ulong)(uint)builderBitIndex,bitIndex_04);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_98,"get_mutable_bit_builder",(allocator<char> *)&local_50);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_98);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_78);
  std::__cxx11::string::~string((string *)&kStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  GenerateSetBit_abi_cxx11_(&local_78,(java *)(ulong)(uint)builderBitIndex,bitIndex_05);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_98,"set_mutable_bit_builder",(allocator<char> *)&local_50);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_98);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_78);
  std::__cxx11::string::~string((string *)&kStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  GenerateClearBit_abi_cxx11_(&local_78,(java *)(ulong)(uint)builderBitIndex,bitIndex_06);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_98,"clear_mutable_bit_builder",(allocator<char> *)&local_50);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_98);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_78);
  std::__cxx11::string::~string((string *)&kStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  GenerateGetBitMutableLocal_abi_cxx11_(&local_78,(java *)(ulong)(uint)builderBitIndex,bitIndex_07);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_98,"get_mutable_bit_parser",(allocator<char> *)&local_50);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_98);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_78);
  std::__cxx11::string::~string((string *)&kStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  GenerateSetBitMutableLocal_abi_cxx11_(&local_78,(java *)(ulong)(uint)builderBitIndex,bitIndex_08);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_98,"set_mutable_bit_parser",(allocator<char> *)&local_50);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_98);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_78);
  std::__cxx11::string::~string((string *)&kStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  GenerateGetBitFromLocal_abi_cxx11_(&local_78,(java *)(ulong)(uint)builderBitIndex,bitIndex_09);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_98,"get_has_field_bit_from_local",(allocator<char> *)&local_50);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_98);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_78);
  std::__cxx11::string::~string((string *)&kStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  GenerateSetBitToLocal_abi_cxx11_(&local_78,this,bitIndex_10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_98,"set_has_field_bit_to_local",(allocator<char> *)&local_50);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_98);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_78);
  std::__cxx11::string::~string((string *)&kStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void SetPrimitiveVariables(const FieldDescriptor* descriptor,
                           int messageBitIndex,
                           int builderBitIndex,
                           map<string, string>* variables) {
  (*variables)["name"] =
    UnderscoresToCamelCase(descriptor);
  (*variables)["capitalized_name"] =
    UnderscoresToCapitalizedCamelCase(descriptor);
  (*variables)["constant_name"] = FieldConstantName(descriptor);
  (*variables)["number"] = SimpleItoa(descriptor->number());
  (*variables)["empty_list"] = "com.google.protobuf.LazyStringArrayList.EMPTY";

  (*variables)["default"] = DefaultValue(descriptor);
  (*variables)["default_init"] = ("= " + DefaultValue(descriptor));
  (*variables)["capitalized_type"] = "String";
  (*variables)["tag"] = SimpleItoa(WireFormat::MakeTag(descriptor));
  (*variables)["tag_size"] = SimpleItoa(
      WireFormat::TagSize(descriptor->number(), GetType(descriptor)));
  (*variables)["null_check"] =
      "  if (value == null) {\n"
      "    throw new NullPointerException();\n"
      "  }\n";

  // TODO(birdo): Add @deprecated javadoc when generating javadoc is supported
  // by the proto compiler
  (*variables)["deprecation"] = descriptor->options().deprecated()
      ? "@java.lang.Deprecated " : "";
  (*variables)["on_changed"] =
      HasDescriptorMethods(descriptor->containing_type()) ? "onChanged();" : "";

  // For singular messages and builders, one bit is used for the hasField bit.
  (*variables)["get_has_field_bit_message"] = GenerateGetBit(messageBitIndex);
  (*variables)["set_has_field_bit_message"] = GenerateSetBit(messageBitIndex);

  (*variables)["get_has_field_bit_builder"] = GenerateGetBit(builderBitIndex);
  (*variables)["set_has_field_bit_builder"] = GenerateSetBit(builderBitIndex);
  (*variables)["clear_has_field_bit_builder"] =
      GenerateClearBit(builderBitIndex);

  // For repated builders, one bit is used for whether the array is immutable.
  (*variables)["get_mutable_bit_builder"] = GenerateGetBit(builderBitIndex);
  (*variables)["set_mutable_bit_builder"] = GenerateSetBit(builderBitIndex);
  (*variables)["clear_mutable_bit_builder"] = GenerateClearBit(builderBitIndex);

  // For repeated fields, one bit is used for whether the array is immutable
  // in the parsing constructor.
  (*variables)["get_mutable_bit_parser"] =
      GenerateGetBitMutableLocal(builderBitIndex);
  (*variables)["set_mutable_bit_parser"] =
      GenerateSetBitMutableLocal(builderBitIndex);

  (*variables)["get_has_field_bit_from_local"] =
      GenerateGetBitFromLocal(builderBitIndex);
  (*variables)["set_has_field_bit_to_local"] =
      GenerateSetBitToLocal(messageBitIndex);
}